

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ShoppingCart.cpp
# Opt level: O0

double __thiscall ShoppingCart::getTotalAmount(ShoppingCart *this)

{
  bool bVar1;
  int iVar2;
  reference ppPVar3;
  Product *this_00;
  double dVar4;
  _Self local_30;
  _List_node_base *local_28;
  _List_iterator<ProductToPurchase_*> local_20;
  iterator it;
  double total;
  ShoppingCart *this_local;
  
  it._M_node = (_List_node_base *)0x0;
  std::_List_iterator<ProductToPurchase_*>::_List_iterator(&local_20);
  local_28 = (_List_node_base *)
             std::__cxx11::list<ProductToPurchase_*,_std::allocator<ProductToPurchase_*>_>::begin
                       (&this->productToPurchase);
  local_20._M_node = local_28;
  while( true ) {
    local_30._M_node =
         (_List_node_base *)
         std::__cxx11::list<ProductToPurchase_*,_std::allocator<ProductToPurchase_*>_>::end
                   (&this->productToPurchase);
    bVar1 = std::operator!=(&local_20,&local_30);
    if (!bVar1) break;
    ppPVar3 = std::_List_iterator<ProductToPurchase_*>::operator*(&local_20);
    iVar2 = ProductToPurchase::getQuantity(*ppPVar3);
    ppPVar3 = std::_List_iterator<ProductToPurchase_*>::operator*(&local_20);
    this_00 = ProductToPurchase::getProduct(*ppPVar3);
    dVar4 = Product::getPrice(this_00);
    it._M_node = (_List_node_base *)((double)iVar2 * dVar4 + it._M_node);
    std::_List_iterator<ProductToPurchase_*>::operator++(&local_20,0);
  }
  return (double)it._M_node;
}

Assistant:

double ShoppingCart::getTotalAmount() {
    double total = 0;
    list<ProductToPurchase*>::iterator it;
    for(it=productToPurchase.begin(); it!=productToPurchase.end(); it++){
        total += (*it)->getQuantity() * (*it)->getProduct()->getPrice();
    }
    return total;
}